

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O2

FTexture * __thiscall
FMugShot::GetFace(FMugShot *this,player_t *player,char *default_face,int accuracy,
                 StateFlags stateflags)

{
  int direction;
  int iVar1;
  FTexture *pFVar2;
  char *skin_face;
  int iVar3;
  int level;
  
  direction = UpdateState(this,player,stateflags);
  iVar1 = player->mo->MugShotMaxHealth;
  if (iVar1 < 0) {
    iVar1 = APlayerPawn::GetMaxHealth(player->mo);
  }
  else if (iVar1 == 0) {
    iVar1 = 100;
  }
  iVar3 = accuracy * (iVar1 / accuracy);
  level = -1;
  do {
    level = level + 1;
    iVar3 = iVar3 - iVar1 / accuracy;
  } while (player->health < iVar3);
  if (this->CurrentState == (FMugShotState *)0x0) {
    return (FTexture *)0x0;
  }
  iVar1 = userinfo_t::GetSkin(&player->userinfo);
  if ((stateflags & CUSTOM) == STANDARD) {
    if (player->morphTics == 0) {
      skin_face = skins[iVar1].face;
    }
    else {
      skin_face = (player->MorphedPlayerClass->Face).Chars;
    }
  }
  else {
    skin_face = (char *)0x0;
  }
  pFVar2 = FMugShotState::GetCurrentFrameTexture
                     (this->CurrentState,default_face,skin_face,level,direction);
  return pFVar2;
}

Assistant:

FTexture *FMugShot::GetFace(player_t *player, const char *default_face, int accuracy, StateFlags stateflags)
{
	int angle = UpdateState(player, stateflags);
	int level = 0;
	int max = player->mo->MugShotMaxHealth;
	if (max < 0)
	{
		max = player->mo->GetMaxHealth();
	}
	else if (max == 0)
	{
		max = 100;
	}
	while (player->health < (accuracy - 1 - level) * (max / accuracy))
	{
		level++;
	}
	if (CurrentState != NULL)
	{
		int skin = player->userinfo.GetSkin();
		const char *skin_face = (stateflags & FMugShot::CUSTOM) ? nullptr : (player->morphTics ? player->MorphedPlayerClass->Face.GetChars() : skins[skin].face);
		return CurrentState->GetCurrentFrameTexture(default_face, skin_face, level, angle);
	}
	return NULL;
}